

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O0

void __thiscall indk::NeuralNet::setStructure(NeuralNet *this,ifstream *Stream)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ostream *this_00;
  string local_68 [8];
  string rstr;
  undefined1 local_38 [8];
  string jstr;
  ifstream *Stream_local;
  NeuralNet *this_local;
  
  jstr.field_2._8_8_ = Stream;
  uVar3 = std::ifstream::is_open();
  if ((uVar3 & 1) == 0) {
    iVar2 = System::getVerbosityLevel();
    if (0 < iVar2) {
      this_00 = std::operator<<((ostream *)&std::cerr,"Error opening file");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    std::__cxx11::string::string((string *)local_38);
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      std::__cxx11::string::string(local_68);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)jstr.field_2._8_8_,local_68);
      std::__cxx11::string::append((string *)local_38);
      std::__cxx11::string::~string(local_68);
    }
    setStructure(this,(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void indk::NeuralNet::setStructure(std::ifstream &Stream) {
    if (!Stream.is_open()) {
        if (indk::System::getVerbosityLevel() > 0) std::cerr << "Error opening file" << std::endl;
        return;
    }
    std::string jstr;
    while (!Stream.eof()) {
        std::string rstr;
        getline(Stream, rstr);
        jstr.append(rstr);
    }
    setStructure(jstr);
}